

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

int __thiscall glslang::TInputScanner::get(TInputScanner *this)

{
  int *piVar1;
  byte bVar2;
  TSourceLoc *pTVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  
  lVar4 = (long)this->currentSource;
  if (this->currentSource < this->numSources) {
    sVar6 = this->currentChar;
    lVar5 = lVar4;
    do {
      if (sVar6 < this->lengths[lVar5]) {
        pTVar3 = this->loc;
        bVar2 = this->sources[lVar5][sVar6];
        pTVar3[lVar4].column = pTVar3[lVar4].column + 1;
        piVar1 = &(this->logicalSourceLoc).column;
        *piVar1 = *piVar1 + 1;
        if (bVar2 == 10) {
          pTVar3[lVar4].line = pTVar3[lVar4].line + 1;
          piVar1 = &(this->logicalSourceLoc).line;
          *piVar1 = *piVar1 + 1;
          (this->logicalSourceLoc).column = 0;
          pTVar3[lVar4].column = 0;
        }
        advance(this);
        return (uint)bVar2;
      }
      lVar5 = lVar5 + 1;
      sVar6 = 0;
    } while (this->numSources != lVar5);
  }
  else {
    this->endOfFileReached = true;
  }
  return -1;
}

Assistant:

int peek()
    {
        if (currentSource >= numSources) {
            endOfFileReached = true;
            return EndOfInput;
        }
        // Make sure we do not read off the end of a string.
        // N.B. Sources can have a length of 0.
        int sourceToRead = currentSource;
        size_t charToRead = currentChar;
        while(charToRead >= lengths[sourceToRead]) {
            charToRead = 0;
            sourceToRead += 1;
            if (sourceToRead >= numSources) {
                return EndOfInput;
            }
        }

        // Here, we care about making negative valued characters positive
        return sources[sourceToRead][charToRead];
    }